

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O2

BOOL Js::JavascriptObject::DefineOwnPropertyHelper
               (RecyclableObject *obj,PropertyId propId,PropertyDescriptor *descriptor,
               ScriptContext *scriptContext,bool throwOnError)

{
  Type *pTVar1;
  JavascriptLibrary *pJVar2;
  Type *type;
  bool bVar3;
  BOOL BVar4;
  JavascriptArray *arr;
  TypedArrayBase *typedArray;
  
  (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x36])
            ();
  pTVar1 = (obj->type).ptr;
  RecyclableObject::ClearWritableDataOnlyDetectionBit(obj);
  if (((obj->type).ptr)->typeId == TypeIds_HostDispatch) {
    BVar4 = JavascriptOperators::SetPropertyDescriptor(obj,propId,descriptor);
  }
  else {
    bVar3 = DynamicObject::IsAnyArray(obj);
    if (bVar3) {
      arr = JavascriptArray::FromAnyArray(obj);
      BVar4 = JavascriptOperators::DefineOwnPropertyForArray
                        (arr,propId,descriptor,throwOnError,scriptContext);
    }
    else {
      bVar3 = DynamicObject::IsAnyTypedArray(obj);
      if (bVar3) {
        typedArray = VarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
        BVar4 = JavascriptOperators::DefineOwnPropertyForTypedArray
                          (typedArray,propId,descriptor,throwOnError,scriptContext);
      }
      else {
        BVar4 = JavascriptOperators::DefineOwnPropertyDescriptor
                          (obj,propId,descriptor,throwOnError,scriptContext,
                           PropertyOperation_StrictMode);
        if (propId == 0x1eb) {
          ObjectPrototypeObject::PostDefineOwnProperty__proto__
                    ((((scriptContext->super_ScriptContextBase).javascriptLibrary)->
                     super_JavascriptLibraryBase).objectPrototype.ptr,obj);
          goto LAB_00b9281e;
        }
      }
    }
  }
  if ((propId == 0x19) &&
     (pJVar2 = (scriptContext->super_ScriptContextBase).javascriptLibrary,
     (pJVar2->super_JavascriptLibraryBase).arrayConstructor.ptr == (RuntimeFunction *)obj)) {
    pJVar2->arrayObjectHasUserDefinedSpecies = true;
  }
LAB_00b9281e:
  bVar3 = RecyclableObject::IsWritableDataOnlyDetectionBitSet(obj);
  if ((bVar3) && (type = (obj->type).ptr, type == pTVar1)) {
    ScriptContext::InvalidatePropertyStringAndSymbolCaches(scriptContext,propId,type);
  }
  if (descriptor->setterSpecified != false || descriptor->getterSpecified != false) {
    ScriptContextOptimizationOverrideInfo::SetSideEffects
              (&scriptContext->optimizationOverrides,SideEffects_Accessor);
  }
  return BVar4;
}

Assistant:

BOOL JavascriptObject::DefineOwnPropertyHelper(RecyclableObject* obj, PropertyId propId, const PropertyDescriptor& descriptor, ScriptContext* scriptContext, bool throwOnError /* = true*/)
{
    BOOL returnValue;
    obj->ThrowIfCannotDefineProperty(propId, descriptor);

    const Type* oldType = obj->GetType();
    obj->ClearWritableDataOnlyDetectionBit();

    // HostDispatch: it doesn't support changing property attributes and default attributes are not per ES5,
    // so there is no benefit in using ES5 DefineOwnPropertyDescriptor for it, use old implementation.
    if (TypeIds_HostDispatch != obj->GetTypeId())
    {
        // for Array Exotic Objects
        if (DynamicObject::IsAnyArray(obj))
        {
            returnValue = JavascriptOperators::DefineOwnPropertyForArray(
                JavascriptArray::FromAnyArray(obj), propId, descriptor, throwOnError, scriptContext);
        }
        // for Integer Indexed Exotic Objects
        else if (DynamicObject::IsAnyTypedArray(obj))
        {
            returnValue = JavascriptOperators::DefineOwnPropertyForTypedArray(
                VarTo<TypedArrayBase>(obj), propId, descriptor, throwOnError, scriptContext);
        }
        // TODO: implement DefineOwnProperty for other object built-in exotic types.
        else
        {
            returnValue = JavascriptOperators::DefineOwnPropertyDescriptor(obj, propId, descriptor, throwOnError, scriptContext, Js::PropertyOperation_StrictMode);
            if (propId == PropertyIds::__proto__)
            {
                scriptContext->GetLibrary()->GetObjectPrototypeObject()->PostDefineOwnProperty__proto__(obj);
            }
        }
    }
    else
    {
        returnValue = JavascriptOperators::SetPropertyDescriptor(obj, propId, descriptor);
    }

    if (propId == PropertyIds::_symbolSpecies && obj == scriptContext->GetLibrary()->GetArrayConstructor())
    {
        scriptContext->GetLibrary()->SetArrayObjectHasUserDefinedSpecies(true);
    }

    if (obj->IsWritableDataOnlyDetectionBitSet())
    {
        if (obj->GetType() == oldType)
        {
            // Also, if the object's type has not changed, we need to ensure that
            // the cached property string for this property, if any, does not
            // specify this object's type.
            scriptContext->InvalidatePropertyStringAndSymbolCaches(propId, obj->GetType());
        }
    }

    if (descriptor.IsAccessorDescriptor())
    {
        scriptContext->optimizationOverrides.SetSideEffects(Js::SideEffects_Accessor);
    }
    return returnValue;
}